

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborinternal_p.h
# Opt level: O0

void * read_bytes_unchecked(CborValue *it,void *dst,size_t offset,size_t n)

{
  void *pvVar1;
  size_t in_RCX;
  size_t in_RDX;
  void *in_RSI;
  void *in_RDI;
  
  pvVar1 = qt_cbor_decoder_read(in_RDI,in_RSI,in_RDX,in_RCX);
  return pvVar1;
}

Assistant:

static inline void *read_bytes_unchecked(const CborValue *it, void *dst, size_t offset, size_t n)
{
    if (CBOR_PARSER_READER_CONTROL >= 0) {
        if (it->parser->flags & CborParserFlag_ExternalSource || CBOR_PARSER_READER_CONTROL != 0) {
#ifdef CBOR_PARSER_READ_BYTES_FUNCTION
            return CBOR_PARSER_READ_BYTES_FUNCTION(it->source.token, dst, offset, n);
#else
            return it->parser->source.ops->read_bytes(it->source.token, dst, offset, n);
#endif
        }
    }

    return memcpy(dst, it->source.ptr + offset, n);
}